

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void CountUniqueBoardPositions<ttt::Board>(int depth)

{
  initializer_list<ttt::Board> __l;
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  reference plVar4;
  size_type sVar5;
  size_type sVar6;
  int in_EDI;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  pair<std::__detail::_Node_iterator<ttt::Board,_true,_true>,_bool> pVar10;
  pair<std::__detail::_Node_iterator<long_long,_true,_false>,_bool> pVar11;
  rep millis;
  time_point t2;
  Board ng;
  long m;
  iterator __end0_1;
  iterator __begin0_1;
  vector<long,_std::allocator<long>_> *__range3;
  vector<long,_std::allocator<long>_> moves;
  Board *g;
  iterator __end0;
  iterator __begin0;
  unordered_set<ttt::Board,_std::hash<ttt::Board>,_std::equal_to<ttt::Board>,_std::allocator<ttt::Board>_>
  *__range2;
  time_point t1;
  unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>
  unique_hashes;
  int i;
  int set_ind;
  unordered_set<ttt::Board,_std::hash<ttt::Board>,_std::equal_to<ttt::Board>,_std::allocator<ttt::Board>_>
  sets [2];
  longlong total;
  unordered_set<ttt::Board,_std::hash<ttt::Board>,_std::equal_to<ttt::Board>,_std::allocator<ttt::Board>_>
  *in_stack_fffffffffffffcf8;
  unordered_set<ttt::Board,_std::hash<ttt::Board>,_std::equal_to<ttt::Board>,_std::allocator<ttt::Board>_>
  *in_stack_fffffffffffffd00;
  iterator in_stack_fffffffffffffd08;
  Board *in_stack_fffffffffffffd10;
  undefined1 *local_2e0;
  Board *in_stack_fffffffffffffd38;
  Board *in_stack_fffffffffffffd40;
  undefined1 *local_1b8;
  duration<long,_std::ratio<1L,_1000L>_> local_1a8;
  rep local_1a0;
  undefined8 local_198;
  _Node_iterator_base<long_long,_false> local_190;
  undefined1 local_188;
  size_t local_180;
  _Node_iterator_base<ttt::Board,_true> local_178;
  undefined1 local_170;
  undefined8 local_168;
  undefined2 local_160;
  long local_158;
  long *local_150;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> local_148;
  undefined1 *local_140;
  undefined1 local_138 [24];
  reference local_120;
  _Node_iterator_base<ttt::Board,_true> local_118;
  _Node_iterator_base<ttt::Board,_true> local_110;
  undefined1 *local_108;
  undefined8 local_100;
  int local_bc;
  int local_b8;
  undefined1 local_a2 [10];
  undefined1 *local_98;
  undefined8 local_90;
  undefined1 local_88 [112];
  undefined1 auStack_18 [8];
  long local_10;
  int local_4;
  
  local_4 = in_EDI;
  poVar3 = std::operator<<((ostream *)&std::cout,"Game size: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,10);
  std::operator<<(poVar3," bytes\n");
  local_10 = 1;
  local_1b8 = local_88;
  do {
    std::
    unordered_set<ttt::Board,_std::hash<ttt::Board>,_std::equal_to<ttt::Board>,_std::allocator<ttt::Board>_>
    ::unordered_set((unordered_set<ttt::Board,_std::hash<ttt::Board>,_std::equal_to<ttt::Board>,_std::allocator<ttt::Board>_>
                     *)0x1f8acd);
    local_1b8 = local_1b8 + 0x38;
  } while (local_1b8 != auStack_18);
  ttt::Board::Board(in_stack_fffffffffffffd10);
  local_98 = local_a2;
  local_90 = 1;
  __l._M_len = (size_type)in_stack_fffffffffffffd10;
  __l._M_array = in_stack_fffffffffffffd08;
  std::
  unordered_set<ttt::Board,_std::hash<ttt::Board>,_std::equal_to<ttt::Board>,_std::allocator<ttt::Board>_>
  ::insert(in_stack_fffffffffffffd00,__l);
  local_b8 = 0;
  for (local_bc = 0; local_bc < local_4; local_bc = local_bc + 1) {
    std::
    unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>
    ::unordered_set((unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>
                     *)0x1f8b7f);
    poVar3 = std::operator<<((ostream *)&std::cout,"Working on depth: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_bc + 1);
    std::operator<<(poVar3,'\n');
    std::
    unordered_set<ttt::Board,_std::hash<ttt::Board>,_std::equal_to<ttt::Board>,_std::allocator<ttt::Board>_>
    ::clear((unordered_set<ttt::Board,_std::hash<ttt::Board>,_std::equal_to<ttt::Board>,_std::allocator<ttt::Board>_>
             *)0x1f8bf2);
    local_100 = std::chrono::_V2::system_clock::now();
    local_108 = local_88 + (long)local_b8 * 0x38;
    local_110._M_cur =
         (__node_type *)
         std::
         unordered_set<ttt::Board,_std::hash<ttt::Board>,_std::equal_to<ttt::Board>,_std::allocator<ttt::Board>_>
         ::begin(in_stack_fffffffffffffcf8);
    local_118._M_cur =
         (__node_type *)
         std::
         unordered_set<ttt::Board,_std::hash<ttt::Board>,_std::equal_to<ttt::Board>,_std::allocator<ttt::Board>_>
         ::end(in_stack_fffffffffffffcf8);
    while (bVar1 = std::__detail::operator!=(&local_110,&local_118), bVar1) {
      local_120 = std::__detail::_Node_iterator<ttt::Board,_true,_true>::operator*
                            ((_Node_iterator<ttt::Board,_true,_true> *)0x1f8c73);
      iVar2 = ttt::Board::GetStatus((Board *)0x1f8c88);
      if (iVar2 == -1) {
        ttt::Board::GetPossibleMoves(in_stack_fffffffffffffd38);
        local_140 = local_138;
        local_148._M_current =
             (long *)std::vector<long,_std::allocator<long>_>::begin
                               ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffcf8);
        local_150 = (long *)std::vector<long,_std::allocator<long>_>::end
                                      ((vector<long,_std::allocator<long>_> *)
                                       in_stack_fffffffffffffcf8);
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>
                                   *)in_stack_fffffffffffffd00,
                                  (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>
                                   *)in_stack_fffffffffffffcf8), bVar1) {
          plVar4 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                   operator*(&local_148);
          local_158 = *plVar4;
          local_160 = *(undefined2 *)((local_120->board)._M_elems[2]._M_elems + 2);
          local_168 = *(undefined8 *)(local_120->board)._M_elems;
          ttt::Board::ApplyMove(in_stack_fffffffffffffd10,(IMove *)in_stack_fffffffffffffd08);
          pVar10 = std::
                   unordered_set<ttt::Board,std::hash<ttt::Board>,std::equal_to<ttt::Board>,std::allocator<ttt::Board>>
                   ::emplace<ttt::Board&>
                             ((unordered_set<ttt::Board,_std::hash<ttt::Board>,_std::equal_to<ttt::Board>,_std::allocator<ttt::Board>_>
                               *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
          local_178._M_cur =
               (__node_type *)pVar10.first.super__Node_iterator_base<ttt::Board,_true>._M_cur;
          local_170 = pVar10.second;
          local_180 = ttt::Board::Hash(in_stack_fffffffffffffd40);
          pVar11 = std::
                   unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>
                   ::emplace<unsigned_long>
                             ((unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>
                               *)in_stack_fffffffffffffd10,
                              (unsigned_long *)in_stack_fffffffffffffd08);
          local_190._M_cur =
               (__node_type *)pVar11.first.super__Node_iterator_base<long_long,_false>._M_cur;
          local_188 = pVar11.second;
          __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
          operator++(&local_148);
        }
        std::vector<long,_std::allocator<long>_>::~vector
                  ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffd10);
      }
      std::__detail::_Node_iterator<ttt::Board,_true,_true>::operator++
                ((_Node_iterator<ttt::Board,_true,_true> *)in_stack_fffffffffffffd00);
    }
    local_198 = std::chrono::_V2::system_clock::now();
    std::chrono::operator-
              ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)in_stack_fffffffffffffd08,
               (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)in_stack_fffffffffffffd00);
    local_1a8.__r =
         (rep)std::chrono::
              duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                        ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffffcf8);
    local_1a0 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_1a8);
    sVar5 = std::
            unordered_set<ttt::Board,_std::hash<ttt::Board>,_std::equal_to<ttt::Board>,_std::allocator<ttt::Board>_>
            ::size((unordered_set<ttt::Board,_std::hash<ttt::Board>,_std::equal_to<ttt::Board>,_std::allocator<ttt::Board>_>
                    *)0x1f8f44);
    local_10 = local_10 + sVar5;
    poVar3 = std::operator<<((ostream *)&std::cout,"Current depth hash count: ");
    sVar6 = std::
            unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>
            ::size((unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>
                    *)0x1f8f84);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar6);
    poVar3 = std::operator<<(poVar3," / ");
    sVar5 = std::
            unordered_set<ttt::Board,_std::hash<ttt::Board>,_std::equal_to<ttt::Board>,_std::allocator<ttt::Board>_>
            ::size((unordered_set<ttt::Board,_std::hash<ttt::Board>,_std::equal_to<ttt::Board>,_std::allocator<ttt::Board>_>
                    *)0x1f8fdd);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar5);
    poVar3 = std::operator<<(poVar3," = ");
    sVar6 = std::
            unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>
            ::size((unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>
                    *)0x1f9022);
    auVar7._8_4_ = (int)(sVar6 >> 0x20);
    auVar7._0_8_ = sVar6;
    auVar7._12_4_ = 0x45300000;
    sVar5 = std::
            unordered_set<ttt::Board,_std::hash<ttt::Board>,_std::equal_to<ttt::Board>,_std::allocator<ttt::Board>_>
            ::size((unordered_set<ttt::Board,_std::hash<ttt::Board>,_std::equal_to<ttt::Board>,_std::allocator<ttt::Board>_>
                    *)0x1f908f);
    auVar9._8_4_ = (int)(sVar5 >> 0x20);
    auVar9._0_8_ = sVar5;
    auVar9._12_4_ = 0x45300000;
    poVar3 = (ostream *)
             std::ostream::operator<<
                       (poVar3,(((auVar7._8_8_ - 1.9342813113834067e+25) +
                                ((double)CONCAT44(0x43300000,(int)sVar6) - 4503599627370496.0)) *
                               100.0) / ((auVar9._8_8_ - 1.9342813113834067e+25) +
                                        ((double)CONCAT44(0x43300000,(int)sVar5) -
                                        4503599627370496.0)));
    std::operator<<(poVar3,"%\n");
    poVar3 = std::operator<<((ostream *)&std::cout,"Current depth node count: ");
    sVar5 = std::
            unordered_set<ttt::Board,_std::hash<ttt::Board>,_std::equal_to<ttt::Board>,_std::allocator<ttt::Board>_>
            ::size((unordered_set<ttt::Board,_std::hash<ttt::Board>,_std::equal_to<ttt::Board>,_std::allocator<ttt::Board>_>
                    *)0x1f912f);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar5);
    poVar3 = std::operator<<(poVar3,", size: ");
    sVar5 = std::
            unordered_set<ttt::Board,_std::hash<ttt::Board>,_std::equal_to<ttt::Board>,_std::allocator<ttt::Board>_>
            ::size((unordered_set<ttt::Board,_std::hash<ttt::Board>,_std::equal_to<ttt::Board>,_std::allocator<ttt::Board>_>
                    *)0x1f9185);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar5 * 10 >> 0x14);
    std::operator<<(poVar3,"MB\n");
    poVar3 = std::operator<<((ostream *)&std::cout,"Current depth duration  : ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1a0 / 1000);
    poVar3 = std::operator<<(poVar3," seconds ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1a0 % 1000);
    in_stack_fffffffffffffd40 = (Board *)std::operator<<(poVar3," milliseconds, ");
    sVar5 = std::
            unordered_set<ttt::Board,_std::hash<ttt::Board>,_std::equal_to<ttt::Board>,_std::allocator<ttt::Board>_>
            ::size((unordered_set<ttt::Board,_std::hash<ttt::Board>,_std::equal_to<ttt::Board>,_std::allocator<ttt::Board>_>
                    *)0x1f929a);
    auVar8._8_4_ = (int)(sVar5 >> 0x20);
    auVar8._0_8_ = sVar5;
    auVar8._12_4_ = 0x45300000;
    in_stack_fffffffffffffd38 =
         (Board *)std::ostream::operator<<
                            ((ostream *)in_stack_fffffffffffffd40,
                             (((auVar8._8_8_ - 1.9342813113834067e+25) +
                              ((double)CONCAT44(0x43300000,(int)sVar5) - 4503599627370496.0)) /
                             (double)local_1a0) * 1000.0);
    std::operator<<((ostream *)in_stack_fffffffffffffd38," nps\n");
    poVar3 = std::operator<<((ostream *)&std::cout,"Total count             : ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_10);
    std::operator<<(poVar3,'\n');
    local_b8 = 1 - local_b8;
    std::
    unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>
    ::~unordered_set((unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>
                      *)0x1f9363);
  }
  local_2e0 = auStack_18;
  do {
    local_2e0 = local_2e0 + -0x38;
    std::
    unordered_set<ttt::Board,_std::hash<ttt::Board>,_std::equal_to<ttt::Board>,_std::allocator<ttt::Board>_>
    ::~unordered_set((unordered_set<ttt::Board,_std::hash<ttt::Board>,_std::equal_to<ttt::Board>,_std::allocator<ttt::Board>_>
                      *)0x1f93b1);
  } while (local_2e0 != local_88);
  return;
}

Assistant:

void
CountUniqueBoardPositions(int depth)
{
    std::cout << "Game size: " << sizeof(IGame) << " bytes\n";
    long long total = 1;
    std::unordered_set<IGame> sets[2];
    sets[0].insert({{}});
    int set_ind = 0;
    for (int i = 0; i < depth; ++i)
    {
        std::unordered_set<long long> unique_hashes;
        std::cout << "Working on depth: " << i + 1 << '\n';
        sets[1 - set_ind].clear();
        auto t1 = std::chrono::high_resolution_clock::now();
        for (const auto &g : sets[set_ind])
        {
            if (g.GetStatus() != game::Undecided)
                continue;
            auto moves = g.GetPossibleMoves();
            for (auto m : moves)
            {
                auto ng = g;
                ng.ApplyMove(m);
                sets[1 - set_ind].emplace(ng);
                unique_hashes.emplace(ng.Hash());
            }
        }
        auto t2 = std::chrono::high_resolution_clock::now();
        auto millis = std::chrono::duration_cast<std::chrono::milliseconds>(t2 - t1).count();
        total += sets[1 - set_ind].size();
        std::cout << "Current depth hash count: " << unique_hashes.size() << " / " << sets[1 - set_ind].size() << " = " << double(unique_hashes.size()) * 100.0 / sets[1 - set_ind].size() << "%\n";
        std::cout << "Current depth node count: " << sets[1 - set_ind].size() << ", size: " << sets[1 - set_ind].size() * sizeof(IGame) / (1 << 20) << "MB\n";
        std::cout << "Current depth duration  : " << millis / 1000 << " seconds " << millis % 1000 << " milliseconds, " << double(sets[1 - set_ind].size()) / millis * 1000 << " nps\n";
        std::cout << "Total count             : " << total << '\n';
        set_ind = 1 - set_ind;
    }
}